

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# civetweb.c
# Opt level: O1

char * mg_md5(char *buf,...)

{
  md5_byte_t *data_00;
  char in_AL;
  byte bVar1;
  void **ppvVar2;
  size_t nbytes;
  uint uVar3;
  undefined8 in_RCX;
  ulong uVar4;
  undefined8 in_RDX;
  long lVar5;
  undefined8 in_RSI;
  undefined8 in_R8;
  undefined8 in_R9;
  undefined4 in_XMM0_Da;
  undefined8 in_XMM1_Qa;
  undefined8 in_XMM2_Qa;
  undefined8 in_XMM3_Qa;
  undefined8 in_XMM4_Qa;
  undefined8 in_XMM5_Qa;
  undefined8 in_XMM6_Qa;
  undefined8 in_XMM7_Qa;
  va_list ap;
  md5_byte_t data [8];
  md5_byte_t hash [16];
  md5_state_t ctx;
  void **local_150;
  md5_byte_t local_140 [8];
  byte abStack_138 [24];
  md5_state_t local_120;
  void *local_c8 [4];
  undefined8 local_a8;
  undefined8 local_a0;
  undefined4 local_98;
  undefined8 local_88;
  undefined8 local_78;
  undefined8 local_68;
  undefined8 local_58;
  undefined8 local_48;
  undefined8 local_38;
  undefined8 local_28;
  
  local_c8[1] = (void *)in_RSI;
  local_c8[2] = (void *)in_RDX;
  local_c8[3] = (void *)in_RCX;
  local_a8 = in_R8;
  local_a0 = in_R9;
  if (in_AL != '\0') {
    local_98 = in_XMM0_Da;
    local_88 = in_XMM1_Qa;
    local_78 = in_XMM2_Qa;
    local_68 = in_XMM3_Qa;
    local_58 = in_XMM4_Qa;
    local_48 = in_XMM5_Qa;
    local_38 = in_XMM6_Qa;
    local_28 = in_XMM7_Qa;
  }
  local_120.count[0] = 0;
  local_120.count[1] = 0;
  local_120.abcd[0] = 0x67452301;
  local_120.abcd[1] = 0xefcdab89;
  local_120.abcd[2] = 0x98badcfe;
  local_120.abcd[3] = 0x10325476;
  uVar3 = 8;
  local_150 = &ap[0].overflow_arg_area;
  while( true ) {
    uVar4 = (ulong)uVar3;
    if (uVar4 < 0x29) {
      uVar3 = uVar3 + 8;
      ppvVar2 = (void **)((long)local_c8 + uVar4);
    }
    else {
      ppvVar2 = local_150;
      local_150 = local_150 + 1;
    }
    data_00 = (md5_byte_t *)*ppvVar2;
    if (data_00 == (md5_byte_t *)0x0) break;
    nbytes = strlen((char *)data_00);
    md5_append(&local_120,data_00,nbytes);
  }
  bVar1 = 0;
  lVar5 = 0;
  do {
    local_140[lVar5] =
         (md5_byte_t)
         (*(uint *)((long)local_120.count + (ulong)((uint)lVar5 & 0xfffffffc)) >> (bVar1 & 0x18));
    lVar5 = lVar5 + 1;
    bVar1 = bVar1 + 8;
  } while (lVar5 != 8);
  md5_append(&local_120,md5_finish_pad,(ulong)((0x37 - (local_120.count[0] >> 3) & 0x3f) + 1));
  md5_append(&local_120,local_140,8);
  bVar1 = 0;
  lVar5 = 0;
  do {
    abStack_138[lVar5] =
         (byte)(*(uint *)((long)local_120.abcd + (ulong)((uint)lVar5 & 0xfffffffc)) >>
               (bVar1 & 0x18));
    lVar5 = lVar5 + 1;
    bVar1 = bVar1 + 8;
  } while (lVar5 != 0x10);
  lVar5 = 0;
  do {
    bVar1 = abStack_138[lVar5];
    buf[lVar5 * 2] = "0123456789abcdef"[bVar1 >> 4];
    buf[lVar5 * 2 + 1] = "0123456789abcdef"[bVar1 & 0xf];
    lVar5 = lVar5 + 1;
  } while (lVar5 != 0x10);
  buf[0x20] = '\0';
  return buf;
}

Assistant:

CIVETWEB_API char *
mg_md5(char buf[33], ...)
{
	md5_byte_t hash[16];
	const char *p;
	va_list ap;
	md5_state_t ctx;

	md5_init(&ctx);

	va_start(ap, buf);
	while ((p = va_arg(ap, const char *)) != NULL) {
		md5_append(&ctx, (const md5_byte_t *)p, strlen(p));
	}
	va_end(ap);

	md5_finish(&ctx, hash);
	bin2str(buf, hash, sizeof(hash));
	return buf;
}